

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::SourceCodeInfo_Location
          (SourceCodeInfo_Location *this,Arena *arena)

{
  Arena *in_RSI;
  SourceCodeInfo_Location *in_RDI;
  Arena *in_stack_ffffffffffffffa8;
  InternalMetadataWithArena *in_stack_ffffffffffffffb0;
  RepeatedField<int> *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffffb0);
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SourceCodeInfo_Location_00959170;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x525b58);
  RepeatedField<int>::RepeatedField(&in_RDI->path_,in_RSI);
  this_00 = &in_RDI->span_;
  RepeatedField<int>::RepeatedField(this_00,in_RSI);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(Arena *)&in_RDI->leading_detached_comments_);
  SharedCtor(in_RDI);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

SourceCodeInfo_Location::SourceCodeInfo_Location(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  path_(arena),
  span_(arena),
  leading_detached_comments_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.SourceCodeInfo.Location)
}